

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro_http_client.hpp
# Opt level: O1

bool __thiscall cinatra::coro_http_client::init_config(coro_http_client *this,config *conf)

{
  _Storage<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true> _Var1;
  optional<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_> *poVar2;
  bool bVar3;
  undefined7 uVar4;
  bool bVar5;
  undefined7 uVar6;
  
  _Var1 = (conf->conn_timeout_duration).
          super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
          ._M_payload.
          super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
          _M_payload;
  bVar5 = (conf->conn_timeout_duration).
          super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
          ._M_payload.
          super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
          _M_engaged;
  uVar6 = *(undefined7 *)
           &(conf->conn_timeout_duration).
            super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
            ._M_payload.
            super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            .field_0x9;
  bVar3 = (conf->req_timeout_duration).
          super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
          ._M_payload.
          super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
          _M_engaged;
  uVar4 = *(undefined7 *)
           &(conf->req_timeout_duration).
            super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
            ._M_payload.
            super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
            .field_0x9;
  (this->config_).req_timeout_duration.
  super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>.
  _M_payload.
  super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
  _M_payload = (conf->req_timeout_duration).
               super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
               ._M_payload;
  poVar2 = &(this->config_).req_timeout_duration;
  (poVar2->
  super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>).
  _M_payload.
  super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
  _M_engaged = bVar3;
  *(undefined7 *)
   &(poVar2->
    super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>).
    _M_payload.
    super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
    field_0x9 = uVar4;
  (this->config_).conn_timeout_duration.
  super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>.
  _M_payload.
  super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
  _M_payload = _Var1;
  poVar2 = &(this->config_).conn_timeout_duration;
  (poVar2->
  super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>).
  _M_payload.
  super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
  _M_engaged = bVar5;
  *(undefined7 *)
   &(poVar2->
    super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>).
    _M_payload.
    super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
    field_0x9 = uVar6;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&(this->config_).sec_key,&conf->sec_key);
  (this->config_).max_single_part_size = conf->max_single_part_size;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&(this->config_).proxy_host,&conf->proxy_host);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&(this->config_).proxy_port,&conf->proxy_port);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&(this->config_).proxy_auth_username,&conf->proxy_auth_username);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&(this->config_).proxy_auth_passwd,&conf->proxy_auth_passwd);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
            (&(this->config_).proxy_auth_token,&conf->proxy_auth_token);
  (this->config_).enable_tcp_no_delay = conf->enable_tcp_no_delay;
  if ((conf->conn_timeout_duration).
      super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
      _M_engaged == true) {
    (this->conn_timeout_duration_).__r =
         (rep)(conf->conn_timeout_duration).
              super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              ._M_payload;
  }
  if ((conf->req_timeout_duration).
      super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>.
      _M_engaged == true) {
    (this->req_timeout_duration_).__r =
         (rep)(conf->req_timeout_duration).
              super__Optional_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
              ._M_payload;
  }
  if ((conf->sec_key)._M_string_length != 0) {
    init_config();
  }
  if (conf->max_single_part_size != 0) {
    this->max_single_part_size_ = conf->max_single_part_size;
  }
  if ((conf->proxy_host)._M_string_length != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&this->proxy_basic_auth_username_,&conf->proxy_host);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&this->proxy_basic_auth_password_,&conf->proxy_port);
  }
  if ((conf->proxy_auth_username)._M_string_length != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&this->proxy_basic_auth_username_,&conf->proxy_auth_username);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&this->proxy_basic_auth_password_,&conf->proxy_auth_passwd);
  }
  if ((conf->proxy_auth_token)._M_string_length != 0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
              (&this->proxy_bearer_token_auth_token_,&conf->proxy_auth_token);
  }
  if (conf->enable_tcp_no_delay == true) {
    this->enable_tcp_no_delay_ = true;
  }
  return true;
}

Assistant:

bool init_config(const config &conf) {
    config_ = conf;
    if (conf.conn_timeout_duration.has_value()) {
      set_conn_timeout(*conf.conn_timeout_duration);
    }
    if (conf.req_timeout_duration.has_value()) {
      set_req_timeout(*conf.req_timeout_duration);
    }
    if (!conf.sec_key.empty()) {
      set_ws_sec_key(conf.sec_key);
    }
    if (conf.max_single_part_size > 0) {
      set_max_single_part_size(conf.max_single_part_size);
    }
    if (!conf.proxy_host.empty()) {
      set_proxy_basic_auth(conf.proxy_host, conf.proxy_port);
    }
    if (!conf.proxy_auth_username.empty()) {
      set_proxy_basic_auth(conf.proxy_auth_username, conf.proxy_auth_passwd);
    }
    if (!conf.proxy_auth_token.empty()) {
      set_proxy_bearer_token_auth(conf.proxy_auth_token);
    }
    if (conf.enable_tcp_no_delay) {
      enable_tcp_no_delay_ = conf.enable_tcp_no_delay;
    }
#ifdef CINATRA_ENABLE_SSL
    set_ssl_schema(conf.use_ssl);
#endif
    return true;
  }